

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aiman.h
# Opt level: O2

void server::aiman::checkai(void)

{
  bool bVar1;
  int iVar2;
  
  if (dorefresh != '\x01') {
    return;
  }
  dorefresh = 0;
  if ((gamemode < 0x17) && (iVar2 = numclients(-1,false,true,false), iVar2 != 0)) {
    checksetup();
    do {
      bVar1 = reassignai();
    } while (bVar1);
    return;
  }
  clearai();
  return;
}

Assistant:

void checkai()
    {
        if(!dorefresh) return;
        dorefresh = false;
        if(m_botmode && numclients(-1, false, true))
        {
            checksetup();
            while(reassignai());
        }
        else clearai();
    }